

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_mul_2(mp_int *a,mp_int *b)

{
  int iVar1;
  ulong uVar2;
  int *in_RSI;
  int *in_RDI;
  mp_digit *tmpb;
  mp_digit *tmpa;
  mp_digit rr;
  mp_digit r;
  int oldused;
  int res;
  int x;
  ulong *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  ulong *puVar3;
  mp_int *in_stack_ffffffffffffffc8;
  ulong local_30;
  int local_1c;
  int local_4;
  
  if ((*in_RDI + 1 <= in_RSI[1]) ||
     (local_4 = mp_grow(in_stack_ffffffffffffffc8,(int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)),
     local_4 == 0)) {
    iVar1 = *in_RSI;
    *in_RSI = *in_RDI;
    local_30 = 0;
    local_48 = *(ulong **)(in_RSI + 4);
    puVar3 = *(ulong **)(in_RDI + 4);
    for (local_1c = 0; local_1c < *in_RDI; local_1c = local_1c + 1) {
      uVar2 = *puVar3;
      *local_48 = (*puVar3 & 0x7ffffffffffffff) << 1 | local_30;
      local_48 = local_48 + 1;
      puVar3 = puVar3 + 1;
      local_30 = uVar2 >> 0x3b;
    }
    if (local_30 != 0) {
      *local_48 = 1;
      *in_RSI = *in_RSI + 1;
    }
    local_48 = (undefined8 *)(*(long *)(in_RSI + 4) + (long)*in_RSI * 8);
    for (local_1c = *in_RSI; local_1c < iVar1; local_1c = local_1c + 1) {
      *local_48 = 0;
      local_48 = local_48 + 1;
    }
    in_RSI[2] = in_RDI[2];
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mp_mul_2(mp_int * a, mp_int * b)
{
  int     x, res, oldused;

  /* grow to accomodate result */
  if (b->alloc < a->used + 1) {
    if ((res = mp_grow (b, a->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  oldused = b->used;
  b->used = a->used;

  {
    register mp_digit r, rr, *tmpa, *tmpb;

    /* alias for source */
    tmpa = a->dp;
    
    /* alias for dest */
    tmpb = b->dp;

    /* carry */
    r = 0;
    for (x = 0; x < a->used; x++) {
    
      /* get what will be the *next* carry bit from the 
       * MSB of the current digit 
       */
      rr = *tmpa >> ((mp_digit)(DIGIT_BIT - 1));
      
      /* now shift up this digit, add in the carry [from the previous] */
      *tmpb++ = ((*tmpa++ << ((mp_digit)1)) | r) & MP_MASK;
      
      /* copy the carry that would be from the source 
       * digit into the next iteration 
       */
      r = rr;
    }

    /* new leading digit? */
    if (r != 0) {
      /* add a MSB which is always 1 at this point */
      *tmpb = 1;
      ++(b->used);
    }

    /* now zero any excess digits on the destination 
     * that we didn't write to 
     */
    tmpb = b->dp + b->used;
    for (x = b->used; x < oldused; x++) {
      *tmpb++ = 0;
    }
  }
  b->sign = a->sign;
  return MP_OKAY;
}